

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::createBinaryOperation
          (TGlslangToSpvTraverser *this,TOperator op,OpDecorations *decorations,Id typeId,Id left,
          Id right,TBasicType typeProxy,bool reduceComparison)

{
  initializer_list<unsigned_int> __l;
  bool bVar1;
  Id IVar2;
  Id result_2;
  Id result_1;
  Id result;
  iterator local_68;
  size_type local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  byte local_3e;
  byte local_3d;
  Op local_3c;
  byte local_38;
  byte local_37;
  bool comparison;
  bool needMatchingVectors;
  Op binOp;
  bool isBool;
  bool isFloat;
  bool isUnsigned;
  bool reduceComparison_local;
  Id right_local;
  Id left_local;
  Id typeId_local;
  OpDecorations *decorations_local;
  TGlslangToSpvTraverser *pTStack_18;
  TOperator op_local;
  TGlslangToSpvTraverser *this_local;
  
  needMatchingVectors = reduceComparison;
  binOp = right;
  _isBool = left;
  right_local = typeId;
  _left_local = decorations;
  decorations_local._4_4_ = op;
  pTStack_18 = this;
  comparison = glslang::isTypeUnsignedInt(typeProxy);
  local_37 = glslang::isTypeFloat(typeProxy);
  local_38 = typeProxy == EbtBool;
  local_3c = OpNop;
  local_3d = 1;
  local_3e = 0;
  if (decorations_local._4_4_ == EOpAdd) {
LAB_00699b59:
    if ((bool)local_37) {
      local_3c = OpFAdd;
    }
    else {
      local_3c = OpIAdd;
    }
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpSub) {
LAB_00699b74:
    if ((bool)local_37) {
      local_3c = OpFSub;
    }
    else {
      local_3c = OpISub;
    }
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpMul) {
LAB_00699b8f:
    if ((bool)local_37) {
      local_3c = OpFMul;
    }
    else {
      local_3c = OpIMul;
    }
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpDiv) {
LAB_00699df9:
    if ((bool)local_37) {
      local_3c = OpFDiv;
    }
    else if ((comparison & 1U) == 0) {
      local_3c = OpSDiv;
    }
    else {
      local_3c = OpUDiv;
    }
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpMod) {
LAB_00699e25:
    if ((bool)local_37) {
      local_3c = OpFMod;
    }
    else if ((comparison & 1U) == 0) {
      local_3c = OpSMod;
    }
    else {
      local_3c = OpUMod;
    }
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpRightShift) {
LAB_00699e51:
    if ((comparison & 1U) == 0) {
      local_3c = OpShiftRightArithmetic;
    }
    else {
      local_3c = OpShiftRightLogical;
    }
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpLeftShift) {
LAB_00699e6c:
    local_3c = OpShiftLeftLogical;
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpAnd) {
LAB_00699e78:
    local_3c = OpBitwiseAnd;
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpInclusiveOr) {
LAB_00699e94:
    local_3c = OpBitwiseOr;
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpExclusiveOr) {
LAB_00699eb0:
    local_3c = OpBitwiseXor;
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ - EOpEqual < 8) {
    local_3e = 1;
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpVectorTimesScalar) {
LAB_00699baa:
    if (((bool)local_37) &&
       ((((bVar1 = spv::Builder::isVector(&this->builder,_isBool), bVar1 ||
          (bVar1 = spv::Builder::isVector(&this->builder,binOp), bVar1)) ||
         (bVar1 = spv::Builder::isCooperativeVector(&this->builder,_isBool), bVar1)) ||
        (bVar1 = spv::Builder::isCooperativeVector(&this->builder,binOp), bVar1)))) {
      bVar1 = spv::Builder::isVector(&this->builder,binOp);
      if ((bVar1) || (bVar1 = spv::Builder::isCooperativeVector(&this->builder,binOp), bVar1)) {
        std::swap<unsigned_int>((uint *)&isBool,&binOp);
      }
      bVar1 = spv::Builder::isScalar(&this->builder,binOp);
      if (!bVar1) {
        __assert_fail("builder.isScalar(right)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x1bba,
                      "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, spv::Id, glslang::TBasicType, bool)"
                     );
      }
      local_3d = 0;
      local_3c = OpVectorTimesScalar;
    }
    else if ((local_37 & 1) == 0) {
      bVar1 = spv::Builder::isCooperativeVector(&this->builder,_isBool);
      if ((bVar1) || (bVar1 = spv::Builder::isCooperativeVector(&this->builder,binOp), bVar1)) {
        bVar1 = spv::Builder::isCooperativeVector(&this->builder,binOp);
        if (bVar1) {
          std::swap<unsigned_int>((uint *)&isBool,&binOp);
        }
        bVar1 = spv::Builder::isScalar(&this->builder,binOp);
        if (!bVar1) {
          __assert_fail("builder.isScalar(right)",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                        ,0x1bc2,
                        "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, spv::Id, glslang::TBasicType, bool)"
                       );
        }
        IVar2 = spv::Builder::getTypeId(&this->builder,_isBool);
        result = binOp;
        local_68 = &result;
        local_60 = 1;
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&result_1 + 3));
        __l._M_len = local_60;
        __l._M_array = local_68;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_58,__l,(allocator_type *)((long)&result_1 + 3));
        binOp = spv::Builder::createCompositeConstruct(&this->builder,IVar2,&local_58);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&result_1 + 3));
      }
      local_3c = OpIMul;
    }
    else {
      local_3c = OpFMul;
    }
    goto LAB_00699f70;
  }
  if (decorations_local._4_4_ == EOpVectorTimesMatrix) {
LAB_00699db9:
    local_3c = OpVectorTimesMatrix;
  }
  else {
    if (decorations_local._4_4_ == EOpMatrixTimesVector) {
      local_3c = OpMatrixTimesVector;
      goto LAB_00699f70;
    }
    if (decorations_local._4_4_ == EOpMatrixTimesScalar) {
LAB_00699dd1:
      local_3c = OpMatrixTimesScalar;
      goto LAB_00699f70;
    }
    if (decorations_local._4_4_ == EOpLogicalOr) {
      local_3d = 0;
      local_3c = OpLogicalOr;
      goto LAB_00699f70;
    }
    if (decorations_local._4_4_ == EOpLogicalXor) {
      local_3d = 0;
      local_3c = OpLogicalNotEqual;
      goto LAB_00699f70;
    }
    if (decorations_local._4_4_ == EOpLogicalAnd) {
      local_3d = 0;
      local_3c = OpLogicalAnd;
      goto LAB_00699f70;
    }
    if (decorations_local._4_4_ != EOpMatrixTimesMatrix) {
      if (decorations_local._4_4_ == EOpOuterProduct) {
        local_3c = OpOuterProduct;
        local_3d = 0;
        goto LAB_00699f70;
      }
      if (decorations_local._4_4_ == EOpAddAssign) goto LAB_00699b59;
      if (decorations_local._4_4_ == EOpSubAssign) goto LAB_00699b74;
      if (decorations_local._4_4_ == EOpMulAssign) goto LAB_00699b8f;
      if (decorations_local._4_4_ == EOpVectorTimesMatrixAssign) goto LAB_00699db9;
      if (decorations_local._4_4_ == EOpVectorTimesScalarAssign) goto LAB_00699baa;
      if (decorations_local._4_4_ == EOpMatrixTimesScalarAssign) goto LAB_00699dd1;
      if (decorations_local._4_4_ != EOpMatrixTimesMatrixAssign) {
        if (decorations_local._4_4_ == EOpDivAssign) goto LAB_00699df9;
        if (decorations_local._4_4_ == EOpModAssign) goto LAB_00699e25;
        if (decorations_local._4_4_ == EOpAndAssign) goto LAB_00699e78;
        if (decorations_local._4_4_ == EOpInclusiveOrAssign) goto LAB_00699e94;
        if (decorations_local._4_4_ != EOpExclusiveOrAssign) {
          if (decorations_local._4_4_ != EOpLeftShiftAssign) {
            if (decorations_local._4_4_ != EOpRightShiftAssign) {
              if (decorations_local._4_4_ == EOpAbsDifference) {
                local_3c = OpAbsISubINTEL;
                if ((comparison & 1U) != 0) {
                  local_3c = OpAbsUSubINTEL;
                }
              }
              else if (decorations_local._4_4_ == EOpAddSaturate) {
                local_3c = OpIAddSatINTEL;
                if ((comparison & 1U) != 0) {
                  local_3c = OpUAddSatINTEL;
                }
              }
              else if (decorations_local._4_4_ == EOpSubSaturate) {
                local_3c = OpISubSatINTEL;
                if ((comparison & 1U) != 0) {
                  local_3c = OpUSubSatINTEL;
                }
              }
              else if (decorations_local._4_4_ == EOpAverage) {
                local_3c = OpIAverageINTEL;
                if ((comparison & 1U) != 0) {
                  local_3c = OpUAverageINTEL;
                }
              }
              else if (decorations_local._4_4_ == EOpAverageRounded) {
                local_3c = OpIAverageRoundedINTEL;
                if ((comparison & 1U) != 0) {
                  local_3c = OpUAverageRoundedINTEL;
                }
              }
              else if (decorations_local._4_4_ == EOpMul32x16) {
                local_3c = OpIMul32x16INTEL;
                if ((comparison & 1U) != 0) {
                  local_3c = OpUMul32x16INTEL;
                }
              }
              else if (decorations_local._4_4_ == EOpExpectEXT) {
                local_3c = OpExpectKHR;
              }
              goto LAB_00699f70;
            }
            goto LAB_00699e51;
          }
          goto LAB_00699e6c;
        }
        goto LAB_00699eb0;
      }
    }
    local_3c = OpMatrixTimesMatrix;
  }
LAB_00699f70:
  if (local_3c == OpNop) {
    if ((local_3e & 1) == 0) {
      this_local._4_4_ = 0;
    }
    else if ((((needMatchingVectors & 1U) == 0) ||
             ((decorations_local._4_4_ != EOpEqual && (decorations_local._4_4_ != EOpNotEqual)))) ||
            ((bVar1 = spv::Builder::isVector(&this->builder,_isBool), !bVar1 &&
             ((bVar1 = spv::Builder::isMatrix(&this->builder,_isBool), !bVar1 &&
              (bVar1 = spv::Builder::isAggregate(&this->builder,_isBool), !bVar1)))))) {
      switch(decorations_local._4_4_) {
      case EOpEqual:
      case EOpVectorEqual:
        if ((local_37 & 1) == 0) {
          if ((local_38 & 1) == 0) {
            local_3c = OpIEqual;
          }
          else {
            local_3c = OpLogicalEqual;
          }
        }
        else {
          local_3c = OpFOrdEqual;
        }
        break;
      case EOpNotEqual:
      case EOpVectorNotEqual:
        if ((local_37 & 1) == 0) {
          if ((local_38 & 1) == 0) {
            local_3c = OpINotEqual;
          }
          else {
            local_3c = OpLogicalNotEqual;
          }
        }
        else {
          local_3c = OpFUnordNotEqual;
        }
        break;
      case EOpLessThan:
        if ((local_37 & 1) == 0) {
          if ((comparison & 1U) == 0) {
            local_3c = OpSLessThan;
          }
          else {
            local_3c = OpULessThan;
          }
        }
        else {
          local_3c = OpFOrdLessThan;
        }
        break;
      case EOpGreaterThan:
        if ((local_37 & 1) == 0) {
          if ((comparison & 1U) == 0) {
            local_3c = OpSGreaterThan;
          }
          else {
            local_3c = OpUGreaterThan;
          }
        }
        else {
          local_3c = OpFOrdGreaterThan;
        }
        break;
      case EOpLessThanEqual:
        if ((local_37 & 1) == 0) {
          if ((comparison & 1U) == 0) {
            local_3c = OpSLessThanEqual;
          }
          else {
            local_3c = OpULessThanEqual;
          }
        }
        else {
          local_3c = OpFOrdLessThanEqual;
        }
        break;
      case EOpGreaterThanEqual:
        if ((local_37 & 1) == 0) {
          if ((comparison & 1U) == 0) {
            local_3c = OpSGreaterThanEqual;
          }
          else {
            local_3c = OpUGreaterThanEqual;
          }
        }
        else {
          local_3c = OpFOrdGreaterThanEqual;
        }
      }
      if (local_3c == OpNop) {
        this_local._4_4_ = 0;
      }
      else {
        IVar2 = spv::Builder::createBinOp(&this->builder,local_3c,right_local,_isBool,binOp);
        anon_unknown_0::OpDecorations::addNoContraction(_left_local,&this->builder,IVar2);
        anon_unknown_0::OpDecorations::addNonUniform(_left_local,&this->builder,IVar2);
        this_local._4_4_ = spv::Builder::setPrecision(&this->builder,IVar2,_left_local->precision);
      }
    }
    else {
      IVar2 = spv::Builder::createCompositeCompare
                        (&this->builder,_left_local->precision,_isBool,binOp,
                         decorations_local._4_4_ == EOpEqual);
      anon_unknown_0::OpDecorations::addNonUniform(_left_local,&this->builder,IVar2);
      this_local._4_4_ = IVar2;
    }
  }
  else {
    if ((local_3e & 1) != 0) {
      __assert_fail("comparison == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1c40,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, spv::Id, glslang::TBasicType, bool)"
                   );
    }
    bVar1 = spv::Builder::isMatrix(&this->builder,_isBool);
    if ((((bVar1) || (bVar1 = spv::Builder::isMatrix(&this->builder,binOp), bVar1)) ||
        (bVar1 = spv::Builder::isCooperativeMatrix(&this->builder,_isBool), bVar1)) ||
       (bVar1 = spv::Builder::isCooperativeMatrix(&this->builder,binOp), bVar1)) {
      this_local._4_4_ =
           createBinaryMatrixOperation(this,local_3c,_left_local,right_local,_isBool,binOp);
    }
    else {
      if ((local_3d & 1) != 0) {
        spv::Builder::promoteScalar(&this->builder,_left_local->precision,(Id *)&isBool,&binOp);
      }
      IVar2 = spv::Builder::createBinOp(&this->builder,local_3c,right_local,_isBool,binOp);
      anon_unknown_0::OpDecorations::addNoContraction(_left_local,&this->builder,IVar2);
      anon_unknown_0::OpDecorations::addNonUniform(_left_local,&this->builder,IVar2);
      this_local._4_4_ = spv::Builder::setPrecision(&this->builder,IVar2,_left_local->precision);
    }
  }
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator op, OpDecorations& decorations,
                                                      spv::Id typeId, spv::Id left, spv::Id right,
                                                      glslang::TBasicType typeProxy, bool reduceComparison)
{
    bool isUnsigned = isTypeUnsignedInt(typeProxy);
    bool isFloat = isTypeFloat(typeProxy);
    bool isBool = typeProxy == glslang::EbtBool;

    spv::Op binOp = spv::OpNop;
    bool needMatchingVectors = true;  // for non-matrix ops, would a scalar need to smear to match a vector?
    bool comparison = false;

    switch (op) {
    case glslang::EOpAdd:
    case glslang::EOpAddAssign:
        if (isFloat)
            binOp = spv::OpFAdd;
        else
            binOp = spv::OpIAdd;
        break;
    case glslang::EOpSub:
    case glslang::EOpSubAssign:
        if (isFloat)
            binOp = spv::OpFSub;
        else
            binOp = spv::OpISub;
        break;
    case glslang::EOpMul:
    case glslang::EOpMulAssign:
        if (isFloat)
            binOp = spv::OpFMul;
        else
            binOp = spv::OpIMul;
        break;
    case glslang::EOpVectorTimesScalar:
    case glslang::EOpVectorTimesScalarAssign:
        if (isFloat && (builder.isVector(left) || builder.isVector(right) || builder.isCooperativeVector(left) || builder.isCooperativeVector(right))) {
            if (builder.isVector(right) || builder.isCooperativeVector(right))
                std::swap(left, right);
            assert(builder.isScalar(right));
            needMatchingVectors = false;
            binOp = spv::OpVectorTimesScalar;
        } else if (isFloat) {
            binOp = spv::OpFMul;
        } else if (builder.isCooperativeVector(left) || builder.isCooperativeVector(right)) {
            if (builder.isCooperativeVector(right))
                std::swap(left, right);
            assert(builder.isScalar(right));
            // Construct a cooperative vector from the scalar
            right = builder.createCompositeConstruct(builder.getTypeId(left), { right });
            binOp = spv::OpIMul;
        } else {
            binOp = spv::OpIMul;
        }
        break;
    case glslang::EOpVectorTimesMatrix:
    case glslang::EOpVectorTimesMatrixAssign:
        binOp = spv::OpVectorTimesMatrix;
        break;
    case glslang::EOpMatrixTimesVector:
        binOp = spv::OpMatrixTimesVector;
        break;
    case glslang::EOpMatrixTimesScalar:
    case glslang::EOpMatrixTimesScalarAssign:
        binOp = spv::OpMatrixTimesScalar;
        break;
    case glslang::EOpMatrixTimesMatrix:
    case glslang::EOpMatrixTimesMatrixAssign:
        binOp = spv::OpMatrixTimesMatrix;
        break;
    case glslang::EOpOuterProduct:
        binOp = spv::OpOuterProduct;
        needMatchingVectors = false;
        break;

    case glslang::EOpDiv:
    case glslang::EOpDivAssign:
        if (isFloat)
            binOp = spv::OpFDiv;
        else if (isUnsigned)
            binOp = spv::OpUDiv;
        else
            binOp = spv::OpSDiv;
        break;
    case glslang::EOpMod:
    case glslang::EOpModAssign:
        if (isFloat)
            binOp = spv::OpFMod;
        else if (isUnsigned)
            binOp = spv::OpUMod;
        else
            binOp = spv::OpSMod;
        break;
    case glslang::EOpRightShift:
    case glslang::EOpRightShiftAssign:
        if (isUnsigned)
            binOp = spv::OpShiftRightLogical;
        else
            binOp = spv::OpShiftRightArithmetic;
        break;
    case glslang::EOpLeftShift:
    case glslang::EOpLeftShiftAssign:
        binOp = spv::OpShiftLeftLogical;
        break;
    case glslang::EOpAnd:
    case glslang::EOpAndAssign:
        binOp = spv::OpBitwiseAnd;
        break;
    case glslang::EOpLogicalAnd:
        needMatchingVectors = false;
        binOp = spv::OpLogicalAnd;
        break;
    case glslang::EOpInclusiveOr:
    case glslang::EOpInclusiveOrAssign:
        binOp = spv::OpBitwiseOr;
        break;
    case glslang::EOpLogicalOr:
        needMatchingVectors = false;
        binOp = spv::OpLogicalOr;
        break;
    case glslang::EOpExclusiveOr:
    case glslang::EOpExclusiveOrAssign:
        binOp = spv::OpBitwiseXor;
        break;
    case glslang::EOpLogicalXor:
        needMatchingVectors = false;
        binOp = spv::OpLogicalNotEqual;
        break;

    case glslang::EOpAbsDifference:
        binOp = isUnsigned ? spv::OpAbsUSubINTEL : spv::OpAbsISubINTEL;
        break;

    case glslang::EOpAddSaturate:
        binOp = isUnsigned ? spv::OpUAddSatINTEL : spv::OpIAddSatINTEL;
        break;

    case glslang::EOpSubSaturate:
        binOp = isUnsigned ? spv::OpUSubSatINTEL : spv::OpISubSatINTEL;
        break;

    case glslang::EOpAverage:
        binOp = isUnsigned ? spv::OpUAverageINTEL : spv::OpIAverageINTEL;
        break;

    case glslang::EOpAverageRounded:
        binOp = isUnsigned ? spv::OpUAverageRoundedINTEL : spv::OpIAverageRoundedINTEL;
        break;

    case glslang::EOpMul32x16:
        binOp = isUnsigned ? spv::OpUMul32x16INTEL : spv::OpIMul32x16INTEL;
        break;

    case glslang::EOpExpectEXT:
        binOp = spv::OpExpectKHR;
        break;

    case glslang::EOpLessThan:
    case glslang::EOpGreaterThan:
    case glslang::EOpLessThanEqual:
    case glslang::EOpGreaterThanEqual:
    case glslang::EOpEqual:
    case glslang::EOpNotEqual:
    case glslang::EOpVectorEqual:
    case glslang::EOpVectorNotEqual:
        comparison = true;
        break;
    default:
        break;
    }

    // handle mapped binary operations (should be non-comparison)
    if (binOp != spv::OpNop) {
        assert(comparison == false);
        if (builder.isMatrix(left) || builder.isMatrix(right) ||
            builder.isCooperativeMatrix(left) || builder.isCooperativeMatrix(right))
            return createBinaryMatrixOperation(binOp, decorations, typeId, left, right);

        // No matrix involved; make both operands be the same number of components, if needed
        if (needMatchingVectors)
            builder.promoteScalar(decorations.precision, left, right);

        spv::Id result = builder.createBinOp(binOp, typeId, left, right);
        decorations.addNoContraction(builder, result);
        decorations.addNonUniform(builder, result);
        return builder.setPrecision(result, decorations.precision);
    }

    if (! comparison)
        return 0;

    // Handle comparison instructions

    if (reduceComparison && (op == glslang::EOpEqual || op == glslang::EOpNotEqual)
                         && (builder.isVector(left) || builder.isMatrix(left) || builder.isAggregate(left))) {
        spv::Id result = builder.createCompositeCompare(decorations.precision, left, right, op == glslang::EOpEqual);
        decorations.addNonUniform(builder, result);
        return result;
    }

    switch (op) {
    case glslang::EOpLessThan:
        if (isFloat)
            binOp = spv::OpFOrdLessThan;
        else if (isUnsigned)
            binOp = spv::OpULessThan;
        else
            binOp = spv::OpSLessThan;
        break;
    case glslang::EOpGreaterThan:
        if (isFloat)
            binOp = spv::OpFOrdGreaterThan;
        else if (isUnsigned)
            binOp = spv::OpUGreaterThan;
        else
            binOp = spv::OpSGreaterThan;
        break;
    case glslang::EOpLessThanEqual:
        if (isFloat)
            binOp = spv::OpFOrdLessThanEqual;
        else if (isUnsigned)
            binOp = spv::OpULessThanEqual;
        else
            binOp = spv::OpSLessThanEqual;
        break;
    case glslang::EOpGreaterThanEqual:
        if (isFloat)
            binOp = spv::OpFOrdGreaterThanEqual;
        else if (isUnsigned)
            binOp = spv::OpUGreaterThanEqual;
        else
            binOp = spv::OpSGreaterThanEqual;
        break;
    case glslang::EOpEqual:
    case glslang::EOpVectorEqual:
        if (isFloat)
            binOp = spv::OpFOrdEqual;
        else if (isBool)
            binOp = spv::OpLogicalEqual;
        else
            binOp = spv::OpIEqual;
        break;
    case glslang::EOpNotEqual:
    case glslang::EOpVectorNotEqual:
        if (isFloat)
            binOp = spv::OpFUnordNotEqual;
        else if (isBool)
            binOp = spv::OpLogicalNotEqual;
        else
            binOp = spv::OpINotEqual;
        break;
    default:
        break;
    }

    if (binOp != spv::OpNop) {
        spv::Id result = builder.createBinOp(binOp, typeId, left, right);
        decorations.addNoContraction(builder, result);
        decorations.addNonUniform(builder, result);
        return builder.setPrecision(result, decorations.precision);
    }

    return 0;
}